

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

void __thiscall
highwayhash::HighwayHashTest<1U>::operator()
          (HighwayHashTest<1U> *this,HHKey *key,char *bytes,size_t size,HHResult64 *expected,
          HHNotify notify)

{
  undefined1 local_b8 [8];
  HHStateT<1U> state;
  HHNotify notify_local;
  HHResult64 *expected_local;
  size_t size_local;
  char *bytes_local;
  HHKey *key_local;
  HighwayHashTest<1U> *this_local;
  
  state.mul1[3] = (uint64_t)notify;
  Portable::HHStatePortable::HHStatePortable((HHStatePortable *)local_b8,*key);
  anon_unknown_5::TestHighwayHash<unsigned_long>
            ((HHStateT<1> *)local_b8,bytes,size,expected,(HHNotify)state.mul1[3]);
  return;
}

Assistant:

void HighwayHashTest<Target>::operator()(const HHKey& key,
                                         const char* HH_RESTRICT bytes,
                                         const size_t size,
                                         const HHResult64* expected,
                                         const HHNotify notify) const {
  HHStateT<Target> state(key);
  TestHighwayHash(&state, bytes, size, expected, notify);
}